

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitTupleExtract
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          TupleExtract *curr)

{
  bool bVar1;
  size_t sVar2;
  Literal *other;
  Literal local_90;
  undefined4 local_78;
  undefined1 local_68 [8];
  Flow flow;
  TupleExtract *curr_local;
  ExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,curr->tuple);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    sVar2 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)local_68);
    if (sVar2 <= *(uint *)(flow.breakTo.super_IString.str._M_str + 0x18)) {
      __assert_fail("flow.values.size() > curr->index",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x5d1,
                    "Flow wasm::ExpressionRunner<wasm::CExpressionRunner>::visitTupleExtract(TupleExtract *) [SubType = wasm::CExpressionRunner]"
                   );
    }
    other = SmallVector<wasm::Literal,_1UL>::operator[]
                      ((SmallVector<wasm::Literal,_1UL> *)local_68,
                       (ulong)*(uint *)(flow.breakTo.super_IString.str._M_str + 0x18));
    wasm::Literal::Literal(&local_90,other);
    Flow::Flow(__return_storage_ptr__,&local_90);
    wasm::Literal::~Literal(&local_90);
  }
  local_78 = 1;
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTupleExtract(TupleExtract* curr) {
    NOTE_ENTER("tuple.extract");
    Flow flow = visit(curr->tuple);
    if (flow.breaking()) {
      return flow;
    }
    assert(flow.values.size() > curr->index);
    return Flow(flow.values[curr->index]);
  }